

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t get_uncompressed_data(archive_read *a,void **buff,size_t size,size_t minimum)

{
  ulong uVar1;
  void *pvVar2;
  ssize_t sVar3;
  ulong in_RCX;
  _func_int_archive_read_filter_ptr *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  ssize_t bytes_avail;
  _7zip_conflict *zip;
  _func_int_archive_read_filter_ptr *in_stack_ffffffffffffffc8;
  archive_read *a_00;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  if ((a_00->bidders[0].options == (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0
      ) && (a_00->bidders[0].free == (_func_int_archive_read_filter_bidder_ptr *)0xffffffffffffffff)
     ) {
    pvVar2 = __archive_read_ahead(a_00,(size_t)in_stack_ffffffffffffffc8,(ssize_t *)0x1ab754);
    *in_RSI = pvVar2;
    if ((long)in_stack_ffffffffffffffc8 < 1) {
      archive_set_error(in_RDI,0x54,"Truncated 7-Zip file data");
      return -0x1e;
    }
    if (*(_func_int_archive_read_filter_ptr **)&(a_00->client).nodes < in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = *(_func_int_archive_read_filter_ptr **)&(a_00->client).nodes;
    }
    if (in_RDX < in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = in_RDX;
    }
    a_00->bidders[0].init = in_stack_ffffffffffffffc8;
  }
  else {
    if ((a_00->client).closer == (undefined1 *)0x0) {
      archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
      return -0x1e;
    }
    uVar1._0_4_ = (a_00->client).nodes;
    uVar1._4_4_ = (a_00->client).cursor;
    if ((uVar1 < in_RCX) && (sVar3 = extract_pack_stream(a,(size_t)buff), sVar3 < 0)) {
      return -0x1e;
    }
    in_stack_ffffffffffffffc8 = in_RDX;
    if (*(_func_int_archive_read_filter_ptr **)&(a_00->client).nodes < in_RDX) {
      in_stack_ffffffffffffffc8 = *(_func_int_archive_read_filter_ptr **)&(a_00->client).nodes;
    }
    *in_RSI = (a_00->client).closer;
    (a_00->client).closer = in_stack_ffffffffffffffc8 + (long)(a_00->client).closer;
  }
  *(long *)&(a_00->client).nodes = *(long *)&(a_00->client).nodes - (long)in_stack_ffffffffffffffc8;
  return (ssize_t)in_stack_ffffffffffffffc8;
}

Assistant:

static ssize_t
get_uncompressed_data(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		/* Copy mode. */

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		*buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file data");
			return (ARCHIVE_FATAL);
		}
		if ((size_t)bytes_avail >
		    zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		if ((size_t)bytes_avail > size)
			bytes_avail = (ssize_t)size;

		zip->pack_stream_bytes_unconsumed = bytes_avail;
	} else if (zip->uncompressed_buffer_pointer == NULL) {
		/* Decompression has failed. */
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	} else {
		/* Packed mode. */
		if (minimum > zip->uncompressed_buffer_bytes_remaining) {
			/*
			 * If remaining uncompressed data size is less than
			 * the minimum size, fill the buffer up to the
			 * minimum size.
			 */
			if (extract_pack_stream(a, minimum) < 0)
				return (ARCHIVE_FATAL);
		}
		if (size > zip->uncompressed_buffer_bytes_remaining)
			bytes_avail = (ssize_t)
			    zip->uncompressed_buffer_bytes_remaining;
		else
			bytes_avail = (ssize_t)size;
		*buff = zip->uncompressed_buffer_pointer;
		zip->uncompressed_buffer_pointer += bytes_avail;
	}
	zip->uncompressed_buffer_bytes_remaining -= bytes_avail;
	return (bytes_avail);
}